

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityPrintNumberHex(UNITY_UINT number,char nibbles_to_print)

{
  char cVar1;
  uint uVar2;
  undefined1 local_19;
  char nibbles;
  int nibble;
  char nibbles_to_print_local;
  UNITY_UINT number_local;
  
  local_19 = nibbles_to_print;
  if (0x10 < (byte)nibbles_to_print) {
    local_19 = '\x10';
  }
  while ('\0' < local_19) {
    local_19 = local_19 + -1;
    uVar2 = (uint)(number >> (local_19 * '\x04' & 0x3fU)) & 0xf;
    cVar1 = (char)uVar2;
    if (uVar2 < 10) {
      putchar((int)(char)(cVar1 + '0'));
    }
    else {
      putchar((int)(char)(cVar1 + '7'));
    }
  }
  return;
}

Assistant:

void UnityPrintNumberHex(const UNITY_UINT number, const char nibbles_to_print)
{
    int nibble;
    char nibbles = nibbles_to_print;
    if ((unsigned)nibbles > (2 * sizeof(number)))
        nibbles = 2 * sizeof(number);

    while (nibbles > 0)
    {
        nibbles--;
        nibble = (int)(number >> (nibbles * 4)) & 0x0F;
        if (nibble <= 9)
        {
            UNITY_OUTPUT_CHAR((char)('0' + nibble));
        }
        else
        {
            UNITY_OUTPUT_CHAR((char)('A' - 10 + nibble));
        }
    }
}